

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::DataParameter::DataParameter(DataParameter *this,DataParameter *from)

{
  void *pvVar1;
  string *psVar2;
  bool bVar3;
  undefined2 uVar4;
  int iVar5;
  float fVar6;
  uint32 uVar7;
  uint32 uVar8;
  uint32 uVar9;
  uint32 uVar10;
  bool bVar11;
  bool bVar12;
  undefined2 uVar13;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DataParameter_0071d310;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->source_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 1) != 0) &&
     (psVar2 = (from->source_).ptr_,
     psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->source_,psVar2);
  }
  (this->mean_file_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 2) != 0) &&
     (psVar2 = (from->mean_file_).ptr_,
     psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->mean_file_,psVar2);
  }
  uVar8 = from->batch_size_;
  uVar9 = from->crop_size_;
  uVar10 = from->rand_skip_;
  bVar11 = from->mirror_;
  bVar12 = from->force_encoded_color_;
  uVar13 = *(undefined2 *)&from->field_0x36;
  bVar3 = from->force_encoded_color_;
  uVar4 = *(undefined2 *)&from->field_0x36;
  iVar5 = from->backend_;
  fVar6 = from->scale_;
  uVar7 = from->prefetch_;
  this->mirror_ = from->mirror_;
  this->force_encoded_color_ = bVar3;
  *(undefined2 *)&this->field_0x36 = uVar4;
  this->backend_ = iVar5;
  this->scale_ = fVar6;
  this->prefetch_ = uVar7;
  this->batch_size_ = uVar8;
  this->crop_size_ = uVar9;
  this->rand_skip_ = uVar10;
  this->mirror_ = bVar11;
  this->force_encoded_color_ = bVar12;
  *(undefined2 *)&this->field_0x36 = uVar13;
  return;
}

Assistant:

DataParameter::DataParameter(const DataParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  source_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_source()) {
    source_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.source_);
  }
  mean_file_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_mean_file()) {
    mean_file_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.mean_file_);
  }
  ::memcpy(&batch_size_, &from.batch_size_,
    reinterpret_cast<char*>(&prefetch_) -
    reinterpret_cast<char*>(&batch_size_) + sizeof(prefetch_));
  // @@protoc_insertion_point(copy_constructor:caffe.DataParameter)
}